

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-fast-dtoa.cpp
# Opt level: O1

bool __thiscall
icu_63::double_conversion::FastDtoa
          (double_conversion *this,double v,FastDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  FastDtoaMode FVar4;
  FastDtoaMode FVar5;
  byte bVar6;
  int iVar7;
  undefined4 in_register_00000014;
  ulong uVar8;
  uint64_t uVar9;
  ulong unsafe_interval;
  int *piVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  DiyFp DVar17;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  DiyFp result;
  DiyFp boundary_plus;
  DiyFp boundary_minus;
  DiyFp ten_mk;
  int *in_stack_ffffffffffffff48;
  int *unit;
  DiyFp local_a8;
  uint64_t local_98;
  double local_90;
  long local_88;
  uint local_80;
  int local_7c;
  DiyFp local_78;
  long local_68;
  DiyFp local_60;
  int *local_50;
  uint64_t local_48;
  DiyFp local_40;
  ulong uVar13;
  
  local_88 = CONCAT44(in_register_00000014,requested_digits);
  piVar10 = buffer._8_8_;
  uVar12 = (uint)this;
  local_a8.f_ = (uint64_t)v;
  local_50 = length;
  if (uVar12 < 2) {
    unit = piVar10;
    local_90 = v;
    DVar17 = Double::AsNormalizedDiyFp((Double *)&local_a8);
    iVar3 = DVar17.e_;
    local_60.f_ = 0;
    local_60.e_ = 0;
    local_78.f_ = 0;
    local_78.e_ = 0;
    if (uVar12 == 0) {
      local_a8.f_ = (uint64_t)local_90;
      Double::NormalizedBoundaries((Double *)&local_a8,&local_60,&local_78);
    }
    else {
      local_a8.f_ = CONCAT44(local_a8.f_._4_4_,(float)local_90);
      Single::NormalizedBoundaries((Single *)&local_a8,&local_60,&local_78);
    }
    local_40.f_ = 0;
    local_40.e_ = 0;
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - iVar3,-0x60 - iVar3,&local_40,&local_7c);
    local_a8.e_ = iVar3;
    local_a8.f_ = DVar17.f_;
    DiyFp::Multiply(&local_a8,&local_40);
    local_98 = local_a8.f_;
    iVar3 = local_a8.e_;
    local_a8._12_4_ = local_60._12_4_;
    local_a8.e_ = local_60.e_;
    local_a8.f_ = local_60.f_;
    DiyFp::Multiply(&local_a8,&local_40);
    uVar9 = local_a8.f_;
    local_a8._12_4_ = local_78._12_4_;
    local_a8.e_ = local_78.e_;
    local_a8.f_ = local_78.f_;
    DiyFp::Multiply(&local_a8,&local_40);
    uVar15 = local_a8.f_ + 1;
    uVar12 = -iVar3;
    uVar13 = (ulong)uVar12;
    bVar6 = (byte)uVar12;
    local_48 = 1L << (bVar6 & 0x3f);
    uVar8 = uVar15 >> (bVar6 & 0x3f);
    uVar14 = (local_a8.f_ - uVar9) + 2;
    local_90 = (double)(local_48 - 1);
    unsafe_interval = uVar15 & (ulong)local_90;
    uVar12 = iVar3 * 0x4d1 + 0x13911 >> 0xc;
    if (*(uint *)(kSmallPowersOfTen + (long)(int)uVar12 * 4 + 4) <= (uint)uVar8) {
      uVar12 = uVar12 + 1;
    }
    uVar11 = *(uint *)(kSmallPowersOfTen + (long)(int)uVar12 * 4);
    *unit = 0;
    local_68 = uVar15 - local_98;
    local_80 = (int)uVar12 >> 0x1f & uVar12;
    local_98 = uVar13;
    while (lVar16 = local_88, 0 < (int)uVar12) {
      uVar15 = uVar8 & 0xffffffff;
      uVar8 = uVar15 % (ulong)uVar11;
      *(char *)(local_88 + *unit) = (char)(uVar15 / uVar11) + '0';
      buffer_00.length_ = *unit + 1;
      *unit = buffer_00.length_;
      uVar15 = (uVar8 << ((byte)uVar13 & 0x3f)) + unsafe_interval;
      if (uVar15 < uVar14) {
        buffer_00.start_ = (char *)local_88;
        buffer_00._12_4_ = 0;
        bVar2 = RoundWeed(buffer_00,(int)local_68,uVar14,uVar15,
                          (ulong)uVar11 << ((byte)uVar13 & 0x3f),1,(uint64_t)unit);
        piVar10 = (int *)(ulong)bVar2;
        uVar13 = local_98;
      }
      else {
        uVar11 = uVar11 / 10;
      }
      uVar12 = uVar12 - 1;
      lVar16 = local_88;
      if (uVar15 < uVar14) goto LAB_0027dcf0;
    }
    uVar9 = 1;
    uVar12 = local_80;
    do {
      uVar9 = uVar9 * 10;
      uVar14 = uVar14 * 10;
      *(char *)(lVar16 + *unit) = (char)(unsafe_interval * 10 >> ((byte)uVar13 & 0x3f)) + '0';
      buffer_01.length_ = *unit + 1;
      *unit = buffer_01.length_;
      unsafe_interval = unsafe_interval * 10 & (ulong)local_90;
      if (unsafe_interval < uVar14) {
        buffer_01.start_ = (char *)lVar16;
        buffer_01._12_4_ = 0;
        bVar2 = RoundWeed(buffer_01,(int)uVar9 * (int)local_68,uVar14,unsafe_interval,local_48,uVar9
                          ,(uint64_t)unit);
        piVar10 = (int *)(ulong)bVar2;
        uVar13 = local_98;
      }
      uVar12 = uVar12 - 1;
    } while (uVar14 <= unsafe_interval);
LAB_0027dcf0:
    local_7c = uVar12 - local_7c;
    goto LAB_0027ddb1;
  }
  if (uVar12 != 2) {
    abort();
  }
  DVar17 = Double::AsNormalizedDiyFp((Double *)&local_a8);
  iVar3 = DVar17.e_;
  local_60.f_ = 0;
  local_60.e_ = 0;
  PowersOfTenCache::GetCachedPowerForBinaryExponentRange
            (-0x7c - iVar3,-0x60 - iVar3,&local_60,(int *)&local_78);
  local_a8.e_ = iVar3;
  unit = piVar10;
  local_a8.f_ = DVar17.f_;
  DiyFp::Multiply(&local_a8,&local_60);
  lVar16 = local_88;
  bVar6 = -(char)local_a8.e_;
  uVar9 = 1L << (bVar6 & 0x3f);
  uVar8 = uVar9 - 1 & local_a8.f_;
  uVar15 = local_a8.f_ >> (bVar6 & 0x3f);
  iVar3 = local_a8.e_ * 0x4d1 + 0x13911 >> 0xc;
  if (*(uint *)(kSmallPowersOfTen + (long)iVar3 * 4 + 4) <= (uint)uVar15) {
    iVar3 = iVar3 + 1;
  }
  uVar12 = *(uint *)(kSmallPowersOfTen + (long)iVar3 * 4);
  uVar1 = (undefined4)(local_a8.f_ >> 0x20);
  *unit = 0;
  do {
    iVar7 = (int)uVar15;
    if (iVar3 < 1) {
      uVar14 = (ulong)uVar12;
      FVar4 = mode;
      break;
    }
    uVar14 = uVar15 & 0xffffffff;
    uVar15 = uVar14 % (ulong)uVar12;
    iVar7 = (int)uVar15;
    *(char *)(local_88 + *unit) = (char)(uVar14 / uVar12) + '0';
    *unit = *unit + 1;
    FVar4 = FAST_DTOA_SHORTEST;
    iVar3 = iVar3 + -1;
    uVar14 = (ulong)uVar12 / 10;
    if (mode == FAST_DTOA_SHORTEST_SINGLE) {
      uVar14 = (ulong)uVar12;
    }
    uVar12 = (uint)uVar14;
    mode = mode - FAST_DTOA_SHORTEST_SINGLE;
  } while (mode != FAST_DTOA_SHORTEST);
  local_a8.f_ = CONCAT44(uVar1,iVar3);
  if (FVar4 == FAST_DTOA_SHORTEST) {
    iVar7 = (iVar7 << (bVar6 & 0x3f)) + (int)uVar8;
    iVar3 = *unit;
    uVar9 = uVar14 << (bVar6 & 0x3f);
    uVar15 = 1;
  }
  else {
    uVar15 = 1;
    bVar2 = false;
    if ((0 < (int)FVar4) && (bVar2 = false, 1 < uVar8)) {
      do {
        uVar15 = uVar15 * 10;
        *(char *)(local_88 + *unit) = (char)(uVar8 * 10 >> (bVar6 & 0x3f)) + '0';
        *unit = *unit + 1;
        FVar5 = FVar4 - FAST_DTOA_SHORTEST_SINGLE;
        uVar8 = uVar8 * 10 & uVar9 - 1;
        iVar3 = iVar3 + -1;
        if ((int)FVar4 < 2) break;
        FVar4 = FVar5;
      } while (uVar15 < uVar8);
      local_a8.f_ = CONCAT44(uVar1,iVar3);
      bVar2 = FVar5 == FAST_DTOA_SHORTEST;
    }
    if (!bVar2) {
      piVar10 = (int *)0x0;
      goto LAB_0027dda7;
    }
    iVar3 = *unit;
    iVar7 = (int)uVar8;
  }
  buffer_02.length_ = iVar3;
  buffer_02.start_ = (char *)local_88;
  buffer_02._12_4_ = 0;
  bVar2 = RoundWeedCounted(buffer_02,iVar7,uVar9,uVar15,(uint64_t)&local_a8,
                           in_stack_ffffffffffffff48);
  piVar10 = (int *)(ulong)bVar2;
LAB_0027dda7:
  local_7c = (int)local_a8.f_ - (int)local_78.f_;
LAB_0027ddb1:
  if (((ulong)piVar10 & 1) != 0) {
    *local_50 = local_7c + *unit;
    *(undefined1 *)(lVar16 + *unit) = 0;
  }
  return (bool)((byte)piVar10 & 1);
}

Assistant:

bool FastDtoa(double v,
              FastDtoaMode mode,
              int requested_digits,
              Vector<char> buffer,
              int* length,
              int* decimal_point) {
  ASSERT(v > 0);
  ASSERT(!Double(v).IsSpecial());

  bool result = false;
  int decimal_exponent = 0;
  switch (mode) {
    case FAST_DTOA_SHORTEST:
    case FAST_DTOA_SHORTEST_SINGLE:
      result = Grisu3(v, mode, buffer, length, &decimal_exponent);
      break;
    case FAST_DTOA_PRECISION:
      result = Grisu3Counted(v, requested_digits,
                             buffer, length, &decimal_exponent);
      break;
    default:
      UNREACHABLE();
  }
  if (result) {
    *decimal_point = *length + decimal_exponent;
    buffer[*length] = '\0';
  }
  return result;
}